

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFAcroFormDocumentHelper.cc
# Opt level: O0

QPDFObjectHandle __thiscall
QPDFAcroFormDocumentHelper::getOrCreateAcroForm(QPDFAcroFormDocumentHelper *this)

{
  QPDFObjectHandle *oh;
  bool bVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  long in_RSI;
  QPDFObjectHandle QVar3;
  QPDFObjectHandle local_d0;
  QPDFObjectHandle local_c0;
  allocator<char> local_a9;
  QPDFObjectHandle local_a8 [2];
  string local_88;
  allocator<char> local_51;
  string local_50 [32];
  string local_30;
  QPDFAcroFormDocumentHelper *this_local;
  QPDFObjectHandle *acroform;
  
  local_30.field_2._M_local_buf[7] = '\0';
  this_local = this;
  QPDF::getRoot((QPDF *)&local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_50,"/AcroForm",&local_51);
  QPDFObjectHandle::getKey((QPDFObjectHandle *)this,&local_30);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&local_30);
  bVar1 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)this);
  _Var2._M_pi = extraout_RDX;
  if (!bVar1) {
    QPDF::getRoot((QPDF *)&local_88);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_a8,"/AcroForm",&local_a9);
    oh = *(QPDFObjectHandle **)(in_RSI + 8);
    QPDFObjectHandle::newDictionary();
    QPDF::makeIndirectObject((QPDF *)&local_c0,oh);
    QPDFObjectHandle::replaceKeyAndGetNew((QPDFObjectHandle *)&local_88.field_2,&local_88,local_a8);
    QPDFObjectHandle::operator=((QPDFObjectHandle *)this,(QPDFObjectHandle *)&local_88.field_2);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&local_88.field_2);
    QPDFObjectHandle::~QPDFObjectHandle(&local_c0);
    QPDFObjectHandle::~QPDFObjectHandle(&local_d0);
    std::__cxx11::string::~string((string *)local_a8);
    std::allocator<char>::~allocator(&local_a9);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&local_88);
    _Var2._M_pi = extraout_RDX_00;
  }
  QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var2._M_pi;
  QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFAcroFormDocumentHelper::getOrCreateAcroForm()
{
    auto acroform = qpdf.getRoot().getKey("/AcroForm");
    if (!acroform.isDictionary()) {
        acroform = qpdf.getRoot().replaceKeyAndGetNew(
            "/AcroForm", qpdf.makeIndirectObject(QPDFObjectHandle::newDictionary()));
    }
    return acroform;
}